

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

ID __thiscall Fl_Plugin_Manager::addPlugin(Fl_Plugin_Manager *this,char *name,Fl_Plugin *plugin)

{
  byte bVar1;
  long lVar2;
  byte bStack_61;
  undefined8 local_60;
  char buf [34];
  Fl_Preferences pin;
  
  Fl_Preferences::Fl_Preferences(&pin,&this->super_Fl_Preferences,name);
  buf[0] = '@';
  local_60 = plugin;
  for (lVar2 = 1; lVar2 != 9; lVar2 = lVar2 + 1) {
    bVar1 = (&bStack_61)[lVar2];
    buf[lVar2 * 2 + -1] = (bVar1 >> 4) + 0x41;
    buf[lVar2 * 2] = (bVar1 & 0xf) + 0x41;
  }
  buf[0x11] = '\0';
  Fl_Preferences::set(&pin,"address",buf);
  ~Fl_Plugin_Manager((Fl_Plugin_Manager *)&pin);
  return pin.node;
}

Assistant:

Fl_Preferences::ID Fl_Plugin_Manager::addPlugin(const char *name, Fl_Plugin *plugin) {
  char buf[34];
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: adding plugin named \"%s\" at 0x%p\n", name, plugin);
#endif
  Fl_Preferences pin(this, name);
  buf[0] = '@'; p2a(plugin, buf+1);
  pin.set("address", buf);
  return pin.id();
}